

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O1

reentrant_put_transaction<void> *
density_tests::detail::
PutTestObject<density::conc_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>_>,_2048UL,_2048UL>
::reentrant_put(reentrant_put_transaction<void> *__return_storage_ptr__,
               conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
               *i_queue,EasyRandom *param_2)

{
  reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_> *this;
  reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_> *this_00;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  void *pvVar4;
  ulong uVar5;
  reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_> transaction;
  
  uVar5 = (ulong)&stack0xffffffffffffffe0 & 0xfffffffffffff800;
  *(undefined8 *)(uVar5 - 0x1808) = 0xc3381f;
  TestObject<2048UL,_2048UL>::TestObject((TestObject<2048UL,_2048UL> *)(uVar5 - 0x1000));
  *(undefined8 *)(uVar5 - 0x1808) = 0xc33832;
  density::
  conc_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>>
  ::
  start_reentrant_emplace<density_tests::TestObject<2048ul,2048ul>,density_tests::TestObject<2048ul,2048ul>>
            ((reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_> *)
             (uVar5 - 0x1040),
             (conc_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>>
              *)i_queue,(TestObject<2048UL,_2048UL> *)(uVar5 - 0x1000));
  this = (reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_> *)(uVar5 - 0x1040);
  uVar1 = *(undefined8 *)(uVar5 - 0x1038);
  uVar2 = *(undefined8 *)(uVar5 - 0x1030);
  uVar3 = *(undefined8 *)(uVar5 - 0x1028);
  this_00 = (reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_> *)
            (uVar5 - 0x1020);
  this_00->m_queue = this->m_queue;
  *(undefined8 *)(uVar5 - 0x1018) = uVar1;
  *(undefined8 *)(uVar5 - 0x1010) = uVar2;
  *(undefined8 *)(uVar5 - 0x1008) = uVar3;
  this->m_queue =
       (conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
        *)0x0;
  *(undefined8 *)(uVar5 - 0x1038) = 0;
  *(undefined8 *)(uVar5 - 0x1808) = 0xc3385d;
  density::
  conc_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>_>
  ::reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_>::
  ~reentrant_put_transaction(this);
  uVar1 = *(undefined8 *)(uVar5 - 0x1018);
  uVar2 = *(undefined8 *)(uVar5 - 0x1010);
  uVar3 = *(undefined8 *)(uVar5 - 0x1008);
  *(conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
    **)(uVar5 - 0x1060) = this_00->m_queue;
  *(undefined8 *)(uVar5 - 0x1058) = uVar1;
  *(undefined8 *)(uVar5 - 0x1050) = uVar2;
  *(undefined8 *)(uVar5 - 0x1048) = uVar3;
  this_00->m_queue =
       (conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
        *)0x0;
  *(undefined8 *)(uVar5 - 0x1018) = 0;
  *(undefined8 *)(uVar5 - 0x1808) = 0xc33885;
  density::
  conc_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>_>
  ::reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_>::
  ~reentrant_put_transaction(this_00);
  *(undefined8 *)(uVar5 - 0x1808) = 0xc33892;
  TestObject<2048UL,_2048UL>::~TestObject((TestObject<2048UL,_2048UL> *)(uVar5 - 0x1000));
  *(undefined8 *)(uVar5 - 0x1808) = 0xc33897;
  exception_checkpoint();
  __return_storage_ptr__->m_queue =
       *(conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
         **)(uVar5 - 0x1060);
  (__return_storage_ptr__->m_put_transaction).m_queue =
       *(heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
         **)(uVar5 - 0x1058);
  pvVar4 = *(void **)(uVar5 - 0x1048);
  (__return_storage_ptr__->m_put_transaction).m_put_data.m_control_block =
       *(ControlBlock **)(uVar5 - 0x1050);
  (__return_storage_ptr__->m_put_transaction).m_put_data.m_user_storage = pvVar4;
  *(undefined8 *)(uVar5 - 0x1060) = 0;
  *(undefined8 *)(uVar5 - 0x1058) = 0;
  *(undefined8 *)(uVar5 - 0x1808) = 0xc338c9;
  density::
  conc_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>_>
  ::reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_>::
  ~reentrant_put_transaction
            ((reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_> *)
             (uVar5 - 0x1060));
  return __return_storage_ptr__;
}

Assistant:

static typename QUEUE::template reentrant_put_transaction<void>
              reentrant_put(QUEUE & i_queue, EasyRandom &)
            {
                auto transaction = i_queue.start_reentrant_push(ElementType());
                exception_checkpoint();
                return std::move(transaction);
            }